

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# environments.cpp
# Opt level: O2

bool fill_environment(shared_ptr<SchemeEnvironment> *env,shared_ptr<SchemePair> *np)

{
  element_type *peVar1;
  bool bVar2;
  shared_ptr<SchemeSymbol> s;
  __shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2> local_58;
  shared_ptr<SchemeObject> local_40;
  
  while( true ) {
    peVar1 = (np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    bVar2 = peVar1 == (element_type *)
                      scheme_nil.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr
            || peVar1 == (element_type *)0x0;
    if (bVar2) {
      return bVar2;
    }
    std::dynamic_pointer_cast<SchemeSymbol,SchemeObject>(&local_40);
    if (local_40.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) break;
    local_58._M_ptr = (element_type *)0x0;
    local_58._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    Context::set(&((env->super___shared_ptr<SchemeEnvironment,_(__gnu_cxx::_Lock_policy)2>)._M_ptr)
                  ->context,
                 (string *)
                 (local_40.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 1),
                 (shared_ptr<SchemeObject> *)&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::dynamic_pointer_cast<SchemePair,SchemeObject>((shared_ptr<SchemeObject> *)&local_58);
    std::__shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>::operator=
              (&np->super___shared_ptr<SchemePair,_(__gnu_cxx::_Lock_policy)2>,&local_58);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_58._M_refcount);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
              (&local_40.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  }
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count
            (&local_40.super___shared_ptr<SchemeObject,_(__gnu_cxx::_Lock_policy)2>._M_refcount);
  return bVar2;
}

Assistant:

static bool fill_environment(const std::shared_ptr<SchemeEnvironment> &env, std::shared_ptr<SchemePair> np)
{
    while(np && np != scheme_nil)
    {
        auto s = std::dynamic_pointer_cast<SchemeSymbol>(np->car);
        if(!s)
            return false;
        env->context.set(s->value, nullptr);
        np = std::dynamic_pointer_cast<SchemePair>(np->cdr);
    }
    return true;
}